

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_immutable_samplers
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *samplers,
          VkSampler **out_sampler)

{
  VkSampler pVVar1;
  DatabaseInterface *resolver_00;
  bool bVar2;
  int iVar3;
  ValueIterator pGVar4;
  Ch *__nptr;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkSampler_T_*>,_false> _Var5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ulonglong uVar6;
  VkSampler *ppVVar7;
  ulong uVar8;
  char *__format;
  long *in_FS_OFFSET;
  uint64_t sampler_hash;
  size_t external_state_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  ulonglong local_90;
  allocator_type local_81;
  VkSampler *local_80;
  Impl *local_78;
  DatabaseInterface *local_70;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_68;
  size_type local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  VkSampler **local_40;
  Value *local_38;
  
  local_78 = this;
  if ((samplers->data_).f.flags != 4) {
    __assert_fail("IsArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                  ,0x66a,
                  "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  uVar8 = (ulong)(samplers->data_).s.length;
  local_70 = resolver;
  local_40 = out_sampler;
  if (uVar8 == 0) {
    local_80 = (VkSampler *)0x0;
  }
  else {
    local_80 = (VkSampler *)ScratchAllocator::allocate_raw(&this->allocator,uVar8 << 3,0x10);
    if ((samplers->data_).f.flags != 4) {
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x68c,
                    "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)((ulong)(samplers->data_).s.str & 0xffffffffffff);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::End(samplers);
  resolver_00 = local_70;
  if (pGVar4 != this_00) {
    local_68 = &(local_78->replayed_samplers)._M_h;
    ppVVar7 = local_80;
    local_38 = samplers;
    do {
      __nptr = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(this_00);
      local_90 = strtoull(__nptr,(char **)0x0,0x10);
      if (local_90 != 0) {
        _Var5._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(local_68,&local_90);
        if (_Var5._M_cur == (__node_type *)0x0) {
          local_60 = 0;
          if ((local_70 != (DatabaseInterface *)0x0) &&
             (iVar3 = (*local_70->_vptr_DatabaseInterface[3])(local_70,1,local_90,&local_60,0,0),
             (char)iVar3 != '\0')) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&local_58,local_60,&local_81);
            iVar3 = (*resolver_00->_vptr_DatabaseInterface[3])
                              (resolver_00,1,local_90,&local_60,
                               local_58.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            uVar6 = local_90;
            if ((char)iVar3 == '\0') {
              if ((*(int *)(*in_FS_OFFSET + -0x20) < 2) &&
                 (bVar2 = Internal::log_thread_callback
                                    (LOG_DEFAULT,
                                     "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                                     ,"Immutable sampler",local_90), !bVar2)) {
                fprintf(_stderr,
                        "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                        ,"Immutable sampler",uVar6);
              }
LAB_0015a617:
              if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start == (pointer)0x0) {
                return false;
              }
              operator_delete(local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_58.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_58.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              return false;
            }
            bVar2 = parse(local_78,iface,resolver_00,
                          local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_58.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
            if (!bVar2) goto LAB_0015a617;
            (*iface->_vptr_StateCreatorInterface[0x10])(iface);
            _Var5._M_cur = (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkSampler_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(local_68,&local_90);
            if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_58.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_58.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            samplers = local_38;
            if (_Var5._M_cur != (__node_type *)0x0) goto LAB_0015a4e5;
          }
          uVar6 = local_90;
          if (1 < *(int *)(*in_FS_OFFSET + -0x20)) {
            return false;
          }
          bVar2 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
                             ,"Immutable sampler",local_90);
          if (bVar2) {
            return false;
          }
          __format = 
          "Fossilize WARN: Referenced %s %016lx, but it does not exist.\nThis can be expected when replaying an archive from Steam.\nIf replaying just the application cache, make sure to replay together with the common cache, as application cache can depend on common cache.\n"
          ;
LAB_0015a5c9:
          fprintf(_stderr,__format,"Immutable sampler",uVar6);
          return false;
        }
        (*iface->_vptr_StateCreatorInterface[0x10])(iface);
LAB_0015a4e5:
        uVar6 = local_90;
        pVVar1 = *(VkSampler *)
                  ((long)&((_Var5._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_long,_VkSampler_T_*>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_unsigned_long,_VkSampler_T_*>_>
                          ._M_storage._M_storage + 8);
        if (pVVar1 == (VkSampler)0x0) {
          if (1 < *(int *)(*in_FS_OFFSET + -0x20)) {
            return false;
          }
          bVar2 = Internal::log_thread_callback
                            (LOG_DEFAULT,
                             "Referenced %s %016lx, but it is VK_NULL_HANDLE.\nThe create info was likely not supported by device.\n"
                             ,"Immutable sampler",local_90);
          if (bVar2) {
            return false;
          }
          __format = 
          "Fossilize WARN: Referenced %s %016lx, but it is VK_NULL_HANDLE.\nThe create info was likely not supported by device.\n"
          ;
          goto LAB_0015a5c9;
        }
        *ppVVar7 = pVVar1;
      }
      this_00 = this_00 + 1;
      ppVVar7 = ppVVar7 + 1;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::End(samplers);
    } while (this_00 != pGVar4);
  }
  *local_40 = local_80;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_immutable_samplers(StateCreatorInterface &iface, DatabaseInterface *resolver,
                                                   const Value &samplers, const VkSampler **out_sampler)
{
	auto *samps = allocator.allocate_n<VkSampler>(samplers.Size());
	auto *ret = samps;
	for (auto itr = samplers.Begin(); itr != samplers.End(); ++itr, samps++)
	{
		auto sampler_hash = string_to_uint64(itr->GetString());
		if (sampler_hash > 0)
		{
			auto sampler_itr = replayed_samplers.find(sampler_hash);
			if (sampler_itr == end(replayed_samplers))
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                                       &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SAMPLER, sampler_hash,
				                          &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Immutable sampler", sampler_hash);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_samplers();
				sampler_itr = replayed_samplers.find(sampler_hash);
			}
			else
				iface.sync_samplers();

			if (sampler_itr == replayed_samplers.end())
			{
				log_missing_resource("Immutable sampler", sampler_hash);
				return false;
			}
			else if (sampler_itr->second == VK_NULL_HANDLE)
			{
				log_invalid_resource("Immutable sampler", sampler_hash);
				return false;
			}

			*samps = sampler_itr->second;
		}
	}

	*out_sampler = ret;
	return true;
}